

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_path_challenge_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  quicly_conn_t *in_RSI;
  int ret;
  quicly_path_challenge_frame_t frame;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  int local_4;
  
  local_4 = quicly_decode_path_challenge_frame
                      ((uint8_t **)in_RSI,*(uint8_t **)&(in_RSI->super).state,
                       (quicly_path_challenge_frame_t *)&stack0xffffffffffffffe0);
  if (local_4 == 0) {
    local_4 = schedule_path_challenge_frame
                        (in_RSI,in_stack_ffffffffffffffe4,
                         (uint8_t *)(ulong)in_stack_ffffffffffffffd8);
  }
  return local_4;
}

Assistant:

static int handle_path_challenge_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_path_challenge_frame_t frame;
    int ret;

    if ((ret = quicly_decode_path_challenge_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    return schedule_path_challenge_frame(conn, 1, frame.data);
}